

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcBinaryStream.h
# Opt level: O1

void __thiscall GrcDiversion::undivert(GrcDiversion *this)

{
  iostream *piVar1;
  long *plVar2;
  long *local_58 [2];
  long local_48 [2];
  long *local_38;
  long local_28 [2];
  
  if (this->m_sbSaved != (streambuf *)0x0) {
    std::ostream::flush();
    std::ios::rdbuf((streambuf *)
                    ((long)&(this->m_strm->super_basic_istream<char,_std::char_traits<char>_>).
                            _vptr_basic_istream +
                    (long)(this->m_strm->super_basic_istream<char,_std::char_traits<char>_>).
                          _vptr_basic_istream[-3]));
    piVar1 = this->m_strm;
    std::__cxx11::stringbuf::str();
    plVar2 = local_58[0];
    std::__cxx11::stringbuf::str();
    std::ostream::write(&(piVar1->super_basic_istream<char,_std::char_traits<char>_>).field_0x10,
                        (long)plVar2);
    if (local_38 != local_28) {
      operator_delete(local_38,local_28[0] + 1);
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    std::ostream::flush();
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
    std::__cxx11::stringbuf::str((string *)this);
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
    this->m_sbSaved = (streambuf *)0x0;
  }
  return;
}

Assistant:

void undivert()
    {
        if (m_sbSaved)
        {
            m_strm.flush();
            m_strm.rdbuf(m_sbSaved);
            m_strm.write(str().data(), str().size());
            m_strm.flush();
            str("");
            m_sbSaved = 0;
        }
    }